

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lysp_stmt_text_fields
                 (lysp_ctx *ctx,lysp_stmt *stmt,char ***texts,yang_arg arg,lysp_ext_instance **exts)

{
  char **ppcVar1;
  lysp_stmt *stmt_00;
  LY_ERR LVar2;
  long *plVar3;
  char *pcVar4;
  undefined4 in_register_0000000c;
  long lVar5;
  char *pcVar6;
  ly_ctx *plVar7;
  lysp_stmt **pplVar8;
  
  LVar2 = lysp_stmt_validate_value(ctx,Y_PREF_IDENTIF_ARG,stmt->arg);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  ppcVar1 = *texts;
  if (ppcVar1 == (char **)0x0) {
    plVar3 = (long *)malloc(0x10);
    if (plVar3 == (long *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      goto LAB_0016715a;
    }
    *plVar3 = 1;
    lVar5 = 1;
  }
  else {
    pcVar6 = ppcVar1[-1];
    ppcVar1[-1] = pcVar6 + 1;
    plVar3 = (long *)realloc(ppcVar1 + -1,(long)pcVar6 * 8 + 0x10);
    if (plVar3 == (long *)0x0) {
      (*texts)[-1] = (*texts)[-1] + -1;
      if (ctx == (lysp_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
LAB_0016715a:
      ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_text_fields");
      return LY_EMEM;
    }
    lVar5 = *plVar3;
  }
  *texts = (char **)(plVar3 + 1);
  plVar3[lVar5] = 0;
  if (ctx == (lysp_ctx *)0x0) {
    plVar7 = (ly_ctx *)0x0;
  }
  else {
    plVar7 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  LVar2 = lydict_insert(plVar7,stmt->arg,0,(char **)(plVar3 + lVar5));
  if (LVar2 == LY_SUCCESS) {
    pplVar8 = &stmt->child;
    do {
      stmt_00 = *pplVar8;
      if (stmt_00 == (lysp_stmt *)0x0) {
        return LY_SUCCESS;
      }
      if (stmt_00->kw != LY_STMT_EXTENSION_INSTANCE) {
        if (ctx == (lysp_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar6 = lyplg_ext_stmt2str(stmt_00->kw);
        pcVar4 = lyplg_ext_stmt2str(stmt->kw);
        ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\".",
                pcVar6,pcVar4);
        return LY_EVALID;
      }
      pcVar6 = (char *)0xffffffffffffffff;
      if (*texts != (char **)0x0) {
        pcVar6 = (*texts)[-1] + -1;
      }
      LVar2 = lysp_stmt_ext(ctx,stmt_00,stmt->kw,(uint64_t)pcVar6,
                            (lysp_ext_instance **)CONCAT44(in_register_0000000c,arg));
      pplVar8 = &stmt_00->next;
    } while (LVar2 == LY_SUCCESS);
  }
  return LVar2;
}

Assistant:

static LY_ERR
lysp_stmt_text_fields(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, const char ***texts, enum yang_arg arg,
        struct lysp_ext_instance **exts)
{
    const char **item;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, arg, stmt->arg));

    /* allocate new pointer */
    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *texts, item, LY_EMEM);
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, item));

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, LY_ARRAY_COUNT(*texts) - 1, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(stmt->kw));
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}